

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O2

msegmentptr segment_holding(mstate m,char *addr)

{
  malloc_segment *pmVar1;
  
  pmVar1 = &_gm_.seg;
  while ((m < (mstate)pmVar1->base ||
         ((mstate)((long)((mstate)pmVar1->base)->smallbins + (pmVar1->size - 0x48)) <= m))) {
    pmVar1 = pmVar1->next;
    if (pmVar1 == (malloc_segment *)0x0) {
      return (msegmentptr)0x0;
    }
  }
  return pmVar1;
}

Assistant:

static msegmentptr segment_holding(mstate m, char* addr) {
  msegmentptr sp = &m->seg;
  for (;;) {
    if (addr >= sp->base && addr < sp->base + sp->size)
      return sp;
    if ((sp = sp->next) == 0)
      return 0;
  }
}